

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

void chip_generate(opl_chip *chip,Bit16s *buff)

{
  opl_slot *poVar1;
  char cVar2;
  Bit8u BVar3;
  short sVar4;
  short sVar5;
  uint uVar6;
  Bit16s BVar7;
  byte bVar8;
  Bit16s **ppBVar9;
  undefined2 uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ushort uVar14;
  Bit8u jj;
  long lVar15;
  long lVar16;
  
  iVar12 = -0x8000;
  if (-0x8000 < chip->mixbuff[1]) {
    iVar12 = chip->mixbuff[1];
  }
  BVar7 = (Bit16s)iVar12;
  if (0x7ffe < iVar12) {
    BVar7 = 0x7fff;
  }
  buff[1] = BVar7;
  lVar16 = 0x630;
  do {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar16);
    sVar4 = *(short *)((long)chip->channel[0].out + lVar16);
    *(short *)((long)chip->channel[0].out + lVar16 + 2) = sVar4;
    sVar5 = *(short *)((long)chip->channel[0].slots + lVar16 + 0x10);
    *(short *)((long)chip->channel[0].out + lVar16) = sVar5;
    cVar2 = *(char *)(*(long *)((long)chip->channel[0].slots + lVar16) + 0x45);
    uVar10 = (undefined2)((int)sVar5 + (int)sVar4 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar10 = 0;
    }
    *(undefined2 *)((long)chip->channel[0].out + lVar16 + -0xe) = uVar10;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    BVar7 = (*envelope_sin[*(byte *)((long)chip->channel[0].out + lVar16 + 0x22)])
                      ((short)(*(uint *)((long)chip->channel[0].out + lVar16 + 0x24) >> 9) +
                       **(short **)((long)chip->channel[0].out + lVar16 + -8),
                       *(Bit16u *)((long)chip->channel[0].out + lVar16 + 6));
    *(Bit16s *)((long)chip->channel[0].slots + lVar16 + 0x10) = BVar7;
    lVar16 = lVar16 + 0x48;
  } while (lVar16 != 0x990);
  lVar16 = 0x990;
  do {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar16);
    sVar4 = *(short *)((long)chip->channel[0].out + lVar16);
    *(short *)((long)chip->channel[0].out + lVar16 + 2) = sVar4;
    sVar5 = *(short *)((long)chip->channel[0].slots + lVar16 + 0x10);
    *(short *)((long)chip->channel[0].out + lVar16) = sVar5;
    cVar2 = *(char *)(*(long *)((long)chip->channel[0].slots + lVar16) + 0x45);
    uVar10 = (undefined2)((int)sVar5 + (int)sVar4 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar10 = 0;
    }
    *(undefined2 *)((long)chip->channel[0].out + lVar16 + -0xe) = uVar10;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    lVar16 = lVar16 + 0x48;
  } while (lVar16 != 0xa68);
  if ((chip->rhy & 0x20) == 0) {
    BVar7 = (*envelope_sin[chip->slot[0xc].reg_wf])
                      ((short)(chip->slot[0xc].pg_phase >> 9) + *chip->slot[0xc].mod,
                       chip->slot[0xc].eg_out);
    chip->slot[0xc].out = BVar7;
    BVar7 = (*envelope_sin[chip->slot[0xd].reg_wf])
                      ((short)(chip->slot[0xd].pg_phase >> 9) + *chip->slot[0xd].mod,
                       chip->slot[0xd].eg_out);
    chip->slot[0xd].out = BVar7;
    BVar7 = (*envelope_sin[chip->slot[0xe].reg_wf])
                      ((short)(chip->slot[0xe].pg_phase >> 9) + *chip->slot[0xe].mod,
                       chip->slot[0xe].eg_out);
    chip->slot[0xe].out = BVar7;
  }
  else {
    chan_generaterhythm1(chip);
  }
  ppBVar9 = chip->channel[0].out;
  lVar16 = 0;
  iVar12 = 0;
  do {
    lVar15 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + *ppBVar9[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    if (chip->FullPan == '\0') {
      uVar14 = uVar14 & chip->channel[lVar16].cha;
    }
    else {
      uVar14 = (ushort)(int)((float)(int)(short)uVar14 * chip->channel[lVar16].fcha);
    }
    iVar12 = iVar12 + (short)uVar14;
    lVar16 = lVar16 + 1;
    ppBVar9 = ppBVar9 + 0xb;
  } while (lVar16 != 0x12);
  chip->mixbuff[0] = iVar12;
  lVar16 = 0xa68;
  do {
    poVar1 = (opl_slot *)((long)chip->channel[0].slots + lVar16);
    sVar4 = *(short *)((long)chip->channel[0].out + lVar16);
    *(short *)((long)chip->channel[0].out + lVar16 + 2) = sVar4;
    sVar5 = *(short *)((long)chip->channel[0].slots + lVar16 + 0x10);
    *(short *)((long)chip->channel[0].out + lVar16) = sVar5;
    cVar2 = *(char *)(*(long *)((long)chip->channel[0].slots + lVar16) + 0x45);
    uVar10 = (undefined2)((int)sVar5 + (int)sVar4 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar10 = 0;
    }
    *(undefined2 *)((long)chip->channel[0].out + lVar16 + -0xe) = uVar10;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    lVar16 = lVar16 + 0x48;
  } while (lVar16 != 0xb40);
  if ((chip->rhy & 0x20) == 0) {
    BVar7 = (*envelope_sin[chip->slot[0xf].reg_wf])
                      ((short)(chip->slot[0xf].pg_phase >> 9) + *chip->slot[0xf].mod,
                       chip->slot[0xf].eg_out);
    chip->slot[0xf].out = BVar7;
    BVar7 = (*envelope_sin[chip->slot[0x10].reg_wf])
                      ((short)(chip->slot[0x10].pg_phase >> 9) + *chip->slot[0x10].mod,
                       chip->slot[0x10].eg_out);
    chip->slot[0x10].out = BVar7;
    BVar7 = (*envelope_sin[chip->slot[0x11].reg_wf])
                      ((short)(chip->slot[0x11].pg_phase >> 9) + *chip->slot[0x11].mod,
                       chip->slot[0x11].eg_out);
    chip->slot[0x11].out = BVar7;
  }
  else {
    chan_generaterhythm2(chip);
  }
  iVar12 = -0x8000;
  if (-0x8000 < chip->mixbuff[0]) {
    iVar12 = chip->mixbuff[0];
  }
  BVar7 = (Bit16s)iVar12;
  if (0x7ffe < iVar12) {
    BVar7 = 0x7fff;
  }
  *buff = BVar7;
  lVar16 = 0;
  do {
    poVar1 = (opl_slot *)((long)chip->slot[0x12].prout + lVar16 + -0x20);
    sVar4 = *(short *)((long)chip->slot[0x12].prout + lVar16);
    *(short *)((long)chip->slot[0x12].prout + lVar16 + 2) = sVar4;
    sVar5 = *(short *)((long)chip->slot[0x12].prout + lVar16 + -0x10);
    *(short *)((long)chip->slot[0x12].prout + lVar16) = sVar5;
    cVar2 = *(char *)(*(long *)((long)chip->slot[0x12].prout + lVar16 + -0x20) + 0x45);
    uVar10 = (undefined2)((int)sVar5 + (int)sVar4 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar10 = 0;
    }
    *(undefined2 *)((long)chip->slot[0x12].prout + lVar16 + -0xe) = uVar10;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    BVar7 = (*envelope_sin[*(byte *)((long)chip->slot[0x12].prout + lVar16 + 0x22)])
                      ((short)(*(uint *)((long)chip->slot[0x12].prout + lVar16 + 0x24) >> 9) +
                       **(short **)((long)chip->slot[0x12].prout + lVar16 + -8),
                       *(Bit16u *)((long)chip->slot[0x12].prout + lVar16 + 6));
    *(Bit16s *)((long)chip->slot[0x12].prout + lVar16 + -0x10) = BVar7;
    lVar16 = lVar16 + 0x48;
  } while (lVar16 != 0x438);
  ppBVar9 = chip->channel[0].out;
  lVar16 = 0;
  iVar12 = 0;
  do {
    lVar15 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + *ppBVar9[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    if (chip->FullPan == '\0') {
      uVar14 = uVar14 & chip->channel[lVar16].chb;
    }
    else {
      uVar14 = (ushort)(int)((float)(int)(short)uVar14 * chip->channel[lVar16].fchb);
    }
    iVar12 = iVar12 + (short)uVar14;
    lVar16 = lVar16 + 1;
    ppBVar9 = ppBVar9 + 0xb;
  } while (lVar16 != 0x12);
  chip->mixbuff[1] = iVar12;
  lVar16 = 0;
  do {
    poVar1 = (opl_slot *)((long)chip->slot[0x21].prout + lVar16 + -0x20);
    sVar4 = *(short *)((long)chip->slot[0x21].prout + lVar16);
    *(short *)((long)chip->slot[0x21].prout + lVar16 + 2) = sVar4;
    sVar5 = *(short *)((long)chip->slot[0x21].prout + lVar16 + -0x10);
    *(short *)((long)chip->slot[0x21].prout + lVar16) = sVar5;
    cVar2 = *(char *)(*(long *)((long)chip->slot[0x21].prout + lVar16 + -0x20) + 0x45);
    uVar10 = (undefined2)((int)sVar5 + (int)sVar4 >> (9U - cVar2 & 0x1f));
    if (cVar2 == '\0') {
      uVar10 = 0;
    }
    *(undefined2 *)((long)chip->slot[0x21].prout + lVar16 + -0xe) = uVar10;
    pg_generate(poVar1);
    envelope_calc(poVar1);
    BVar7 = (*envelope_sin[*(byte *)((long)chip->slot[0x21].prout + lVar16 + 0x22)])
                      ((short)(*(uint *)((long)chip->slot[0x21].prout + lVar16 + 0x24) >> 9) +
                       **(short **)((long)chip->slot[0x21].prout + lVar16 + -8),
                       *(Bit16u *)((long)chip->slot[0x21].prout + lVar16 + 6));
    *(Bit16s *)((long)chip->slot[0x21].prout + lVar16 + -0x10) = BVar7;
    lVar16 = lVar16 + 0x48;
  } while (lVar16 != 0xd8);
  uVar6._0_2_ = chip->timer;
  uVar6._2_1_ = chip->newm;
  uVar6._3_1_ = chip->nts;
  uVar11 = chip->noise >> 1;
  uVar13 = uVar11 ^ 0x400181;
  if ((chip->noise & 1) == 0) {
    uVar13 = uVar11;
  }
  chip->noise = uVar13;
  if ((~uVar6 & 0x3f) != 0) goto LAB_00325844;
  BVar3 = chip->tremtval;
  if (chip->tremdir == '\0') {
    if (BVar3 != 'i') {
      bVar8 = BVar3 + 1;
      goto LAB_00325821;
    }
    chip->tremtval = 'h';
    chip->tremdir = '\x01';
    bVar8 = 0x68;
  }
  else if (BVar3 == '\0') {
    chip->tremtval = '\x01';
    chip->tremdir = '\0';
    bVar8 = 0;
  }
  else {
    bVar8 = BVar3 - 1;
LAB_00325821:
    chip->tremtval = bVar8;
  }
  chip->tremval = (bVar8 >> 2) >> (chip->dam * -2 + 2 & 0x1f);
LAB_00325844:
  chip->timer = (undefined2)uVar6 + 1;
  return;
}

Assistant:

void chip_generate(opl_chip *chip, Bit16s *buff) {
	buff[1] = limshort(chip->mixbuff[1]);

	for (Bit8u ii = 0; ii < 12; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	for (Bit8u ii = 12; ii < 15; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
	}

	if (chip->rhy & 0x20) {
		chan_generaterhythm1(chip);
	}
	else {
		slot_generate(&chip->slot[12]);
		slot_generate(&chip->slot[13]);
		slot_generate(&chip->slot[14]);
	}

	chip->mixbuff[0] = 0;
	for (Bit8u ii = 0; ii < 18; ii++) {
		Bit16s accm = 0;
		for (Bit8u jj = 0; jj < 4; jj++) {
			accm += *chip->channel[ii].out[jj];
		}
		if (chip->FullPan) {
			chip->mixbuff[0] += (Bit16s)(accm * chip->channel[ii].fcha);
		}
		else {
			chip->mixbuff[0] += (Bit16s)(accm & chip->channel[ii].cha);
		}
	}

	for (Bit8u ii = 15; ii < 18; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
	}

	if (chip->rhy & 0x20) {
		chan_generaterhythm2(chip);
	}
	else {
		slot_generate(&chip->slot[15]);
		slot_generate(&chip->slot[16]);
		slot_generate(&chip->slot[17]);
	}

	buff[0] = limshort(chip->mixbuff[0]);

	for (Bit8u ii = 18; ii < 33; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	chip->mixbuff[1] = 0;
	for (Bit8u ii = 0; ii < 18; ii++) {
		Bit16s accm = 0;
		for (Bit8u jj = 0; jj < 4; jj++) {
			accm += *chip->channel[ii].out[jj];
		}
		if (chip->FullPan) {
			chip->mixbuff[1] += (Bit16s)(accm * chip->channel[ii].fchb);
		}
		else {
			chip->mixbuff[1] += (Bit16s)(accm & chip->channel[ii].chb);
		}
	}

	for (Bit8u ii = 33; ii < 36; ii++) {
		slot_calcfb(&chip->slot[ii]);
		pg_generate(&chip->slot[ii]);
		envelope_calc(&chip->slot[ii]);
		slot_generate(&chip->slot[ii]);
	}

	n_generate(chip);

	if ((chip->timer & 0x3f) == 0x3f) {
		if (!chip->tremdir) {
			if (chip->tremtval == 105) {
				chip->tremtval--;
				chip->tremdir = 1;
			}
			else {
				chip->tremtval++;
			}
		}
		else {
			if (chip->tremtval == 0) {
				chip->tremtval++;
				chip->tremdir = 0;
			}
			else {
				chip->tremtval--;
			}
		}
		chip->tremval = (chip->tremtval >> 2) >> ((1 - chip->dam) << 1);
	}

	chip->timer++;
}